

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverseNodeDependencies
          (Node *this,Reader *schemaNode,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  uint *puVar1;
  bool bVar2;
  Which WVar3;
  Which WVar4;
  uint64_t uVar5;
  Iterator IVar6;
  Iterator IVar7;
  Iterator IVar8;
  Iterator IVar9;
  Reader local_5e0;
  Reader local_5b0;
  Reader local_580;
  Reader local_550;
  Reader local_520;
  Reader local_4f0;
  Reader local_4c0;
  Reader local_490;
  undefined1 local_460 [8];
  Reader method;
  undefined1 local_420 [8];
  Iterator __end3_3;
  undefined1 local_400 [8];
  Iterator __begin3_3;
  Reader *__range3_3;
  uint64_t local_388;
  uint64_t superclassId;
  Reader superclass;
  undefined1 local_340 [8];
  Iterator __end3_2;
  undefined1 local_320 [8];
  Iterator __begin3_2;
  Reader *__range3_2;
  Reader interface;
  undefined1 local_278 [8];
  Reader enumerant;
  undefined1 local_238 [8];
  Iterator __end3_1;
  undefined1 local_218 [8];
  Iterator __begin3_1;
  Reader local_1d8;
  Reader *local_1a8;
  Reader *__range3_1;
  Reader local_170;
  Reader local_140;
  undefined1 local_110 [8];
  Reader field;
  undefined1 local_d0 [8];
  Iterator __end3;
  undefined1 local_b0 [8];
  Iterator __begin3;
  Reader local_70;
  Reader *local_40;
  Reader *__range3;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  Reader *pRStack_18;
  uint eagerness_local;
  Reader *schemaNode_local;
  Node *this_local;
  
  __range3 = (Reader *)sourceInfo;
  sourceInfo_local = (Vector<capnp::schema::Node::SourceInfo::Reader> *)finalLoader;
  finalLoader_local = (SchemaLoader *)seen;
  seen_local._4_4_ = eagerness;
  pRStack_18 = schemaNode;
  schemaNode_local = (Reader *)this;
  WVar3 = capnp::schema::Node::Reader::which(schemaNode);
  switch(WVar3) {
  case STRUCT:
    capnp::schema::Node::Reader::getStruct((Reader *)&__begin3.index,pRStack_18);
    capnp::schema::Node::Struct::Reader::getFields(&local_70,(Reader *)&__begin3.index);
    local_40 = &local_70;
    IVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::begin(&local_70);
    __end3._8_8_ = IVar6.container;
    __begin3.container._0_4_ = IVar6.index;
    local_b0 = (undefined1  [8])__end3._8_8_;
    IVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::end(local_40);
    field._reader._40_8_ = IVar6.container;
    __end3.container._0_4_ = IVar6.index;
    local_d0 = (undefined1  [8])field._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                 *)local_b0,
                                (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                 *)local_d0), ((bVar2 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
      ::operator*((Reader *)local_110,
                  (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                   *)local_b0);
      WVar4 = capnp::schema::Field::Reader::which((Reader *)local_110);
      if (WVar4 == SLOT) {
        capnp::schema::Field::Reader::getSlot(&local_170,(Reader *)local_110);
        capnp::schema::Field::Slot::Reader::getType(&local_140,&local_170);
        traverseType(this,&local_140,seen_local._4_4_,
                     (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                      *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                     (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
      }
      capnp::schema::Field::Reader::getAnnotations((Reader *)&__range3_1,(Reader *)local_110);
      traverseAnnotations(this,(Reader *)&__range3_1,seen_local._4_4_,
                          (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                           *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                          (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                    *)local_b0);
    }
    break;
  case ENUM:
    capnp::schema::Node::Reader::getEnum((Reader *)&__begin3_1.index,pRStack_18);
    capnp::schema::Node::Enum::Reader::getEnumerants(&local_1d8,(Reader *)&__begin3_1.index);
    local_1a8 = &local_1d8;
    IVar7 = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::begin(&local_1d8);
    __end3_1._8_8_ = IVar7.container;
    __begin3_1.container._0_4_ = IVar7.index;
    local_218 = (undefined1  [8])__end3_1._8_8_;
    IVar7 = List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader::end(local_1a8);
    enumerant._reader._40_8_ = IVar7.container;
    __end3_1.container._0_4_ = IVar7.index;
    local_238 = (undefined1  [8])enumerant._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                                 *)local_218,
                                (IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                                 *)local_238), ((bVar2 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
      ::operator*((Reader *)local_278,
                  (IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                   *)local_218);
      capnp::schema::Enumerant::Reader::getAnnotations
                ((Reader *)&interface._reader.nestingLimit,(Reader *)local_278);
      traverseAnnotations(this,(Reader *)&interface._reader.nestingLimit,seen_local._4_4_,
                          (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                           *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                          (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Enumerant,_(capnp::Kind)3>::Reader,_capnp::schema::Enumerant::Reader>
                    *)local_218);
    }
    break;
  case INTERFACE:
    capnp::schema::Node::Reader::getInterface((Reader *)&__range3_2,pRStack_18);
    puVar1 = &__begin3_2.index;
    capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)puVar1,(Reader *)&__range3_2);
    IVar8 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
    __end3_2._8_8_ = IVar8.container;
    __begin3_2.container._0_4_ = IVar8.index;
    local_320 = (undefined1  [8])__end3_2._8_8_;
    IVar8 = List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    superclass._reader._40_8_ = IVar8.container;
    __end3_2.container._0_4_ = IVar8.index;
    local_340 = (undefined1  [8])superclass._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                                 *)local_320,
                                (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                                 *)local_340), ((bVar2 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
      ::operator*((Reader *)&superclassId,
                  (IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                   *)local_320);
      local_388 = capnp::schema::Superclass::Reader::getId((Reader *)&superclassId);
      if (local_388 != 0) {
        traverseDependency(this,local_388,seen_local._4_4_,
                           (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                            *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                           (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3,false);
      }
      capnp::schema::Superclass::Reader::getBrand((Reader *)&__range3_3,(Reader *)&superclassId);
      traverseBrand(this,(Reader *)&__range3_3,seen_local._4_4_,
                    (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                     *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                    (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader,_capnp::schema::Superclass::Reader>
                    *)local_320);
    }
    puVar1 = &__begin3_3.index;
    capnp::schema::Node::Interface::Reader::getMethods((Reader *)puVar1,(Reader *)&__range3_2);
    IVar9 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::begin((Reader *)puVar1);
    __end3_3._8_8_ = IVar9.container;
    __begin3_3.container._0_4_ = IVar9.index;
    local_400 = (undefined1  [8])__end3_3._8_8_;
    IVar9 = List<capnp::schema::Method,_(capnp::Kind)3>::Reader::end((Reader *)puVar1);
    method._reader._40_8_ = IVar9.container;
    __end3_3.container._0_4_ = IVar9.index;
    local_420 = (undefined1  [8])method._reader._40_8_;
    while (bVar2 = capnp::_::
                   IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                   ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                                 *)local_400,
                                (IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                                 *)local_420), ((bVar2 ^ 0xffU) & 1) != 0) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
      ::operator*((Reader *)local_460,
                  (IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                   *)local_400);
      uVar5 = capnp::schema::Method::Reader::getParamStructType((Reader *)local_460);
      traverseDependency(this,uVar5,seen_local._4_4_,
                         (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                          *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                         (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3,true);
      capnp::schema::Method::Reader::getParamBrand(&local_490,(Reader *)local_460);
      traverseBrand(this,&local_490,seen_local._4_4_,
                    (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                     *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                    (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
      uVar5 = capnp::schema::Method::Reader::getResultStructType((Reader *)local_460);
      traverseDependency(this,uVar5,seen_local._4_4_,
                         (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                          *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                         (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3,true);
      capnp::schema::Method::Reader::getResultBrand(&local_4c0,(Reader *)local_460);
      traverseBrand(this,&local_4c0,seen_local._4_4_,
                    (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                     *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                    (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
      capnp::schema::Method::Reader::getAnnotations(&local_4f0,(Reader *)local_460);
      traverseAnnotations(this,&local_4f0,seen_local._4_4_,
                          (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                           *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                          (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
      ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Method,_(capnp::Kind)3>::Reader,_capnp::schema::Method::Reader>
                    *)local_400);
    }
    break;
  case CONST:
    capnp::schema::Node::Reader::getConst(&local_550,pRStack_18);
    capnp::schema::Node::Const::Reader::getType(&local_520,&local_550);
    traverseType(this,&local_520,seen_local._4_4_,
                 (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                  *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                 (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
    break;
  case ANNOTATION:
    capnp::schema::Node::Reader::getAnnotation(&local_5b0,pRStack_18);
    capnp::schema::Node::Annotation::Reader::getType(&local_580,&local_5b0);
    traverseType(this,&local_580,seen_local._4_4_,
                 (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                  *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                 (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
  }
  capnp::schema::Node::Reader::getAnnotations(&local_5e0,pRStack_18);
  traverseAnnotations(this,&local_5e0,seen_local._4_4_,
                      (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                       *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                      (Vector<capnp::schema::Node::SourceInfo::Reader> *)__range3);
  return;
}

Assistant:

void Compiler::Node::traverseNodeDependencies(
    const schema::Node::Reader& schemaNode, uint eagerness,
    std::unordered_map<Node*, uint>& seen,
    const SchemaLoader& finalLoader,
    kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  switch (schemaNode.which()) {
    case schema::Node::STRUCT:
      for (auto field: schemaNode.getStruct().getFields()) {
        switch (field.which()) {
          case schema::Field::SLOT:
            traverseType(field.getSlot().getType(), eagerness, seen, finalLoader, sourceInfo);
            break;
          case schema::Field::GROUP:
            // Aux node will be scanned later.
            break;
        }

        traverseAnnotations(field.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::ENUM:
      for (auto enumerant: schemaNode.getEnum().getEnumerants()) {
        traverseAnnotations(enumerant.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;

    case schema::Node::INTERFACE: {
      auto interface = schemaNode.getInterface();
      for (auto superclass: interface.getSuperclasses()) {
        uint64_t superclassId = superclass.getId();
        if (superclassId != 0) {  // if zero, we reported an error earlier
          traverseDependency(superclassId, eagerness, seen, finalLoader, sourceInfo);
        }
        traverseBrand(superclass.getBrand(), eagerness, seen, finalLoader, sourceInfo);
      }
      for (auto method: interface.getMethods()) {
        traverseDependency(
            method.getParamStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getParamBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseDependency(
            method.getResultStructType(), eagerness, seen, finalLoader, sourceInfo, true);
        traverseBrand(method.getResultBrand(), eagerness, seen, finalLoader, sourceInfo);
        traverseAnnotations(method.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
      }
      break;
    }

    case schema::Node::CONST:
      traverseType(schemaNode.getConst().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    case schema::Node::ANNOTATION:
      traverseType(schemaNode.getAnnotation().getType(), eagerness, seen, finalLoader, sourceInfo);
      break;

    default:
      break;
  }

  traverseAnnotations(schemaNode.getAnnotations(), eagerness, seen, finalLoader, sourceInfo);
}